

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iStack.h
# Opt level: O3

void __thiscall
Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>::iStack
          (iStack<Imaginer::Utils::iRpn::RPNnode> *this,int *size)

{
  RPNnode *pRVar1;
  ulong uVar2;
  long lVar3;
  
  lVar3 = (long)*size;
  this->_size = *size;
  this->_top = -1;
  uVar2 = 0xffffffffffffffff;
  if (-1 < lVar3) {
    uVar2 = lVar3 << 4;
  }
  pRVar1 = (RPNnode *)operator_new__(uVar2);
  if (lVar3 != 0) {
    uVar2 = 0;
    do {
      (&pRVar1->_is)[uVar2] = false;
      *(undefined8 *)((long)&pRVar1->_node + uVar2) = 0;
      uVar2 = uVar2 + 0x10;
    } while (lVar3 << 4 != uVar2);
  }
  this->_data = pRVar1;
  return;
}

Assistant:

iStack(const int& size = 1024):_size(size),_top(-1)
    {
        _data = new Type[_size];
    }